

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

Value * __thiscall
ot::commissioner::Interpreter::ProcessMlr
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  string *this_00;
  string *this_01;
  ErrorCode EVar1;
  element_type *peVar2;
  char *pcVar3;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  uint32_t timeout;
  CommissionerAppPtr commissioner;
  uint local_18c;
  CommissionerAppPtr local_188;
  ErrorCode local_170;
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  undefined1 *local_148;
  undefined8 local_140;
  undefined1 local_138 [16];
  ErrorCode local_128;
  undefined1 *local_120;
  long local_118;
  undefined1 local_110 [16];
  string local_100;
  ErrorCode local_e0 [2];
  undefined1 *local_d8;
  long local_d0;
  undefined1 local_c8 [16];
  Error local_b8;
  Error local_90;
  format_string_checker<char> local_68;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  this_00 = &(__return_storage_ptr__->mError).mMessage;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  this_01 = &__return_storage_ptr__->mData;
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  local_188.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_188.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x41) {
    local_68.types_[0] = none_type;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ = "too few arguments"
    ;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x11;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    begin = "too few arguments";
    local_68.context_.types_ = local_68.types_;
    do {
      pcVar3 = begin + 1;
      if (*begin == '}') {
        if ((pcVar3 == "") || (*pcVar3 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar3 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar3 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",&local_68);
      }
      begin = pcVar3;
    } while (pcVar3 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_100,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    local_128 = kInvalidArgs;
    local_120 = local_110;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,local_100._M_dataplus._M_p,
               local_100._M_dataplus._M_p + local_100._M_string_length);
    local_170 = local_128;
    local_168[0] = local_158;
    std::__cxx11::string::_M_construct<char*>((string *)local_168,local_120,local_120 + local_118);
    local_140 = 0;
    local_138[0] = 0;
    (__return_storage_ptr__->mError).mCode = local_170;
    local_148 = local_138;
    std::__cxx11::string::operator=((string *)this_00,(string *)local_168);
    std::__cxx11::string::operator=((string *)this_01,(string *)&local_148);
    if (local_148 != local_138) {
      operator_delete(local_148);
    }
    if (local_168[0] != local_158) {
      operator_delete(local_168[0]);
    }
    if (local_120 != local_110) {
      operator_delete(local_120);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
  }
  else {
    JobManager::GetSelectedCommissioner
              (&local_90,
               (this->mJobManager).
               super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &local_188);
    local_170 = local_90.mCode;
    local_168[0] = local_158;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_168,local_90.mMessage._M_dataplus._M_p,
               local_90.mMessage._M_dataplus._M_p + local_90.mMessage._M_string_length);
    local_140 = 0;
    local_138[0] = 0;
    (__return_storage_ptr__->mError).mCode = local_170;
    local_148 = local_138;
    std::__cxx11::string::operator=((string *)this_00,(string *)local_168);
    std::__cxx11::string::operator=((string *)this_01,(string *)&local_148);
    EVar1 = (__return_storage_ptr__->mError).mCode;
    if (local_148 != local_138) {
      operator_delete(local_148);
    }
    if (local_168[0] != local_158) {
      operator_delete(local_168[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.mMessage._M_dataplus._M_p != &local_90.mMessage.field_2) {
      operator_delete(local_90.mMessage._M_dataplus._M_p);
    }
    if (EVar1 == kNone) {
      utils::ParseInteger<unsigned_int>
                (&local_b8,&local_18c,
                 (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish + -1);
      local_170 = local_b8.mCode;
      local_168[0] = local_158;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_168,local_b8.mMessage._M_dataplus._M_p,
                 local_b8.mMessage._M_dataplus._M_p + local_b8.mMessage._M_string_length);
      local_140 = 0;
      local_138[0] = 0;
      (__return_storage_ptr__->mError).mCode = local_170;
      local_148 = local_138;
      std::__cxx11::string::operator=((string *)this_00,(string *)local_168);
      std::__cxx11::string::operator=((string *)this_01,(string *)&local_148);
      EVar1 = (__return_storage_ptr__->mError).mCode;
      if (local_148 != local_138) {
        operator_delete(local_148);
      }
      if (local_168[0] != local_158) {
        operator_delete(local_168[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.mMessage._M_dataplus._M_p != &local_b8.mMessage.field_2) {
        operator_delete(local_b8.mMessage._M_dataplus._M_p);
      }
      peVar2 = local_188.
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (EVar1 == kNone) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_68,
                   (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 1,
                   (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish + -1,(allocator_type *)&local_100);
        (*(peVar2->super_CommissionerHandler)._vptr_CommissionerHandler[0x44])
                  (local_e0,peVar2,&local_68,(ulong)local_18c);
        local_170 = local_e0[0];
        local_168[0] = local_158;
        std::__cxx11::string::_M_construct<char*>((string *)local_168,local_d8,local_d8 + local_d0);
        local_140 = 0;
        local_138[0] = 0;
        (__return_storage_ptr__->mError).mCode = local_170;
        local_148 = local_138;
        std::__cxx11::string::operator=((string *)this_00,(string *)local_168);
        std::__cxx11::string::operator=((string *)this_01,(string *)&local_148);
        if (local_148 != local_138) {
          operator_delete(local_148);
        }
        if (local_168[0] != local_158) {
          operator_delete(local_168[0]);
        }
        if (local_d8 != local_c8) {
          operator_delete(local_d8);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_68);
      }
    }
  }
  if (local_188.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessMlr(const Expression &aExpr)
{
    uint32_t           timeout;
    Value              value;
    CommissionerAppPtr commissioner = nullptr;

    VerifyOrExit(aExpr.size() >= 3, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
    SuccessOrExit(value = ParseInteger(timeout, aExpr.back()));
    SuccessOrExit(value = commissioner->RegisterMulticastListener({aExpr.begin() + 1, aExpr.end() - 1},
                                                                  CommissionerApp::Seconds(timeout)));
exit:
    return value;
}